

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O1

void __thiscall ot::commissioner::coap::Coap::HandleResponse(Coap *this,Response *aResponse)

{
  byte bVar1;
  string *psVar2;
  bool bVar3;
  RequestHolder *aRequestHolder;
  char *pcVar4;
  _Alloc_hider _Var5;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  string_view fmt;
  format_args args;
  string requestUri;
  string local_168;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  string local_118;
  undefined1 local_f8 [8];
  _Alloc_hider local_f0;
  char local_e0 [16];
  Error local_d0;
  Error local_a8;
  Error local_80;
  Error local_58;
  
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"UNKNOWN_URI","");
  aRequestHolder = RequestsCache::Match(&this->mRequestsCache,aResponse);
  if (aRequestHolder == (RequestHolder *)0x0) {
    if ((undefined1  [12])((undefined1  [12])aResponse->mHeader & (undefined1  [12])0x8) !=
        (undefined1  [12])0x0) goto LAB_001fab82;
    SendEmptyMessage(&local_58,this,kReset,aResponse);
    psVar2 = &local_58.mMessage;
LAB_001fab74:
    _Var5._M_p = *(pointer *)((psVar2->field_2)._M_local_buf + -0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var5._M_p == &psVar2->field_2) goto LAB_001fab82;
  }
  else {
    Message::GetOption((Error *)&local_148,
                       (aRequestHolder->mRequest).
                       super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,&local_168,kUriPath);
    if (local_148.context_.super_basic_format_parse_context<char>.format_str_.data_ !=
        (char *)((long)&local_148 + 0x18U)) {
      operator_delete(local_148.context_.super_basic_format_parse_context<char>.format_str_.data_);
    }
    if (4 < (aResponse->mHeader).mCode) {
      Message::SetRequestUri(aResponse,&local_168);
    }
    switch(*(uint *)&aResponse->mHeader >> 2 & 3) {
    case 0:
      SendEmptyMessage(&local_80,this,kAcknowledgment,aResponse);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.mMessage._M_dataplus._M_p != &local_80.mMessage.field_2) {
        operator_delete(local_80.mMessage._M_dataplus._M_p);
      }
    case 1:
      paVar6 = &local_d0.mMessage.field_2;
      local_d0.mCode = kNone;
      local_d0.mMessage._M_string_length = 0;
      local_d0.mMessage.field_2._M_local_buf[0] = '\0';
      local_d0.mMessage._M_dataplus._M_p = (pointer)paVar6;
      FinalizeTransaction(this,aRequestHolder,aResponse,&local_d0);
      _Var5._M_p = local_d0.mMessage._M_dataplus._M_p;
      break;
    case 2:
      bVar1 = (aResponse->mHeader).mCode;
      if (bVar1 == 0) {
        if ((undefined1  [12])
            ((undefined1  [12])
             ((aRequestHolder->mRequest).
              super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             )->mHeader & (undefined1  [12])0xc) == (undefined1  [12])0x0) {
          aRequestHolder->mAcknowledged = true;
        }
        if ((aRequestHolder->mHandler).super__Function_base._M_manager == (_Manager_type)0x0) {
          RequestsCache::Eliminate(&this->mRequestsCache,aRequestHolder);
        }
        goto LAB_001fab82;
      }
      if ((bVar1 < 5) ||
         (bVar3 = Message::IsTokenEqual
                            (aResponse,
                             (aRequestHolder->mRequest).
                             super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr), !bVar3)) goto LAB_001fab82;
      paVar6 = &local_a8.mMessage.field_2;
      local_a8.mCode = kNone;
      local_a8.mMessage._M_string_length = 0;
      local_a8.mMessage.field_2._M_local_buf[0] = '\0';
      local_a8.mMessage._M_dataplus._M_p = (pointer)paVar6;
      FinalizeTransaction(this,aRequestHolder,aResponse,&local_a8);
      _Var5._M_p = local_a8.mMessage._M_dataplus._M_p;
      break;
    case 3:
      if ((aResponse->mHeader).mCode != '\0') goto LAB_001fab82;
      local_148.types_[0] = string_type;
      local_148.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "request to {} was reset by peer";
      local_148.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1f;
      local_148.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_148.context_.super_basic_format_parse_context<char>._20_4_ = 1;
      local_148.parse_funcs_[0] =
           ::fmt::v10::detail::
           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
      begin = "request to {} was reset by peer";
      local_148.context_.types_ = local_148.types_;
      do {
        pcVar4 = begin + 1;
        if (*begin == '}') {
          if ((pcVar4 == "") || (*pcVar4 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar4 = begin + 2;
        }
        else if (*begin == '{') {
          pcVar4 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (begin,"",&local_148);
        }
        begin = pcVar4;
      } while (pcVar4 != "");
      local_148._0_8_ = local_168._M_dataplus._M_p;
      local_148.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           (char *)local_168._M_string_length;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x1f;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&local_148;
      ::fmt::v10::vformat_abi_cxx11_(&local_118,(v10 *)"request to {} was reset by peer",fmt,args);
      local_f8._0_4_ = kAborted;
      local_f0._M_p = local_e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,local_118._M_dataplus._M_p,
                 local_118._M_dataplus._M_p + local_118._M_string_length);
      FinalizeTransaction(this,aRequestHolder,(Response *)0x0,(Error *)local_f8);
      if (local_f0._M_p != local_e0) {
        operator_delete(local_f0._M_p);
      }
      psVar2 = &local_118;
      goto LAB_001fab74;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var5._M_p == paVar6) goto LAB_001fab82;
  }
  operator_delete(_Var5._M_p);
LAB_001fab82:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Coap::HandleResponse(Response &aResponse)
{
    const RequestHolder *requestHolder = nullptr;
    std::string          requestUri    = "UNKNOWN_URI";

    requestHolder = mRequestsCache.Match(aResponse);
    if (requestHolder == nullptr)
    {
        if (aResponse.IsConfirmable() || aResponse.IsNonConfirmable())
        {
            IgnoreError(SendReset(aResponse));
        }
        ExitNow();
    }

    requestHolder->mRequest->GetUriPath(requestUri).IgnoreError();
    if (aResponse.IsResponse())
    {
        aResponse.SetRequestUri(requestUri);
    }

    switch (aResponse.GetType())
    {
    case Type::kReset:
        if (aResponse.IsEmpty())
        {
            FinalizeTransaction(*requestHolder, nullptr, ERROR_ABORTED("request to {} was reset by peer", requestUri));
        }

        // Silently ignore non-empty reset messages (RFC 7252, p. 4.2).
        break;

    case Type::kAcknowledgment:
        if (aResponse.IsEmpty())
        {
            // Empty acknowledgment.
            if (requestHolder->mRequest->IsConfirmable())
            {
                requestHolder->mAcknowledged = true;
            }

            // Remove the message if response is not expected, otherwise await response.
            if (requestHolder->mHandler == nullptr)
            {
                mRequestsCache.Eliminate(*requestHolder);
            }
        }
        else if (aResponse.IsResponse() && aResponse.IsTokenEqual(*requestHolder->mRequest))
        {
            // Piggybacked response.
            FinalizeTransaction(*requestHolder, &aResponse, ERROR_NONE);
        }

        // Silently ignore acknowledgments carrying requests (RFC 7252, p. 4.2)
        // or with no token match (RFC 7252, p. 5.3.2).
        break;

    case Type::kConfirmable:
        // Send empty ACK if it is a CON message.
        IgnoreError(SendAck(aResponse));

        // fall through

    case Type::kNonConfirmable:
        // Separate response.
        FinalizeTransaction(*requestHolder, &aResponse, ERROR_NONE);
        break;
    }

exit:
    return;
}